

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void google::protobuf::descriptor_unittest::anon_unknown_532::FillValidMapEntry
               (FileDescriptorProto *file_proto)

{
  Message *in_RCX;
  char *in_R9;
  string_view input;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  input._M_str = (char *)file_proto;
  input._M_len = (size_t)
                 "name: \'foo.proto\' message_type {   name: \'Foo\'   field {     name: \'foo_map\' number: 1 label:LABEL_REPEATED     type_name: \'FooMapEntry\'   }   nested_type {     name: \'FooMapEntry\'     options {  map_entry: true }     field {       name: \'key\' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL     }     field {       name: \'value\' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL     }   } } message_type {   name: \'Bar\'   extension_range { start: 1 end: 10 }} "
  ;
  local_40[0] = (internal)TextFormat::ParseFromString((TextFormat *)0x1c9,input,in_RCX);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \'foo.proto\' \" \"message_type { \" \"  name: \'Foo\' \" \"  field { \" \"    name: \'foo_map\' number: 1 label:LABEL_REPEATED \" \"    type_name: \'FooMapEntry\' \" \"  } \" \"  nested_type { \" \"    name: \'FooMapEntry\' \" \"    options {  map_entry: true } \" \"    field { \" \"      name: \'key\' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL \" \"    } \" \"    field { \" \"      name: \'value\' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL \" \"    } \" \"  } \" \"} \" \"message_type { \" \"  name: \'Bar\' \" \"  extension_range { start: 1 end: 10 }\" \"} \", file_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1bf5,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

void FillValidMapEntry(FileDescriptorProto* file_proto) {
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: 'foo.proto' "
      "message_type { "
      "  name: 'Foo' "
      "  field { "
      "    name: 'foo_map' number: 1 label:LABEL_REPEATED "
      "    type_name: 'FooMapEntry' "
      "  } "
      "  nested_type { "
      "    name: 'FooMapEntry' "
      "    options {  map_entry: true } "
      "    field { "
      "      name: 'key' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL "
      "    } "
      "    field { "
      "      name: 'value' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL "
      "    } "
      "  } "
      "} "
      "message_type { "
      "  name: 'Bar' "
      "  extension_range { start: 1 end: 10 }"
      "} ",
      file_proto));
}